

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

string * __thiscall
libtorrent::aux::print_listen_interfaces_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,
          vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
          *in)

{
  uint uVar1;
  ulong *puVar2;
  char *__s;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  char *__cp;
  byte *pbVar9;
  byte *__src;
  char cVar10;
  size_t __n;
  listen_interface_t *i;
  ulong *puVar11;
  bytes_type bytes;
  char src_buf [64];
  char local_88;
  byte local_87;
  char local_78 [19];
  byte local_65 [53];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar11 = *(ulong **)this;
  puVar2 = *(ulong **)(this + 8);
  if (puVar11 != puVar2) {
    do {
      cVar10 = (char)__return_storage_ptr__;
      if (__return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::string::push_back(cVar10);
      }
      __s = (char *)*puVar11;
      piVar6 = __errno_location();
      *piVar6 = 0;
      pcVar7 = strchr(__s,0x25);
      __cp = __s;
      if (pcVar7 == (char *)0x0) {
LAB_00312e86:
        iVar5 = inet_pton(10,__cp,&local_88);
        bVar3 = *piVar6 != 0 || iVar5 < 1;
        if (0 < iVar5 && pcVar7 != (char *)0x0) {
          if (((local_87 & 0xc0) == 0x80 && local_88 == -2) ||
             ((local_87 & 0xf) == 2 && local_88 == -1)) {
            if_nametoindex(pcVar7 + 1);
          }
        }
      }
      else {
        __n = (long)pcVar7 - (long)__s;
        bVar3 = true;
        if ((long)__n < 0x40) {
          __cp = local_78;
          memcpy(__cp,__s,__n);
          local_78[__n] = '\0';
          goto LAB_00312e86;
        }
      }
      if (bVar3) {
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar11);
      }
      else {
        ::std::__cxx11::string::push_back(cVar10);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*puVar11);
        ::std::__cxx11::string::push_back(cVar10);
      }
      ::std::__cxx11::string::push_back(cVar10);
      uVar1 = (uint)puVar11[4];
      local_65[2] = 0;
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      uVar8 = (ulong)uVar4;
      pbVar9 = local_65 + 1;
      do {
        __src = pbVar9;
        *__src = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
        pbVar9 = __src + -1;
        bVar3 = 9 < uVar8;
        uVar8 = uVar8 / 10;
      } while (bVar3);
      if ((int)uVar1 < 0) {
        *pbVar9 = 0x2d;
        __src = pbVar9;
      }
      memmove(local_78,__src,(size_t)(local_65 + (3 - (long)__src)));
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (*(char *)((long)puVar11 + 0x24) == '\x01') {
        ::std::__cxx11::string::push_back(cVar10);
      }
      if (*(char *)((long)puVar11 + 0x25) == '\x01') {
        ::std::__cxx11::string::push_back(cVar10);
      }
      puVar11 = puVar11 + 5;
    } while (puVar11 != puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_listen_interfaces(std::vector<listen_interface_t> const& in)
	{
		std::string ret;
		for (auto const& i : in)
		{
			if (!ret.empty()) ret += ',';

			error_code ec;
			make_address_v6(i.device, ec);
			if (!ec)
			{
				// IPv6 addresses must be wrapped in square brackets
				ret += '[';
				ret += i.device;
				ret += ']';
			}
			else
			{
				ret += i.device;
			}
			ret += ':';
			ret += to_string(i.port).data();
			if (i.ssl) ret += 's';
			if (i.local) ret += 'l';
		}

		return ret;
	}